

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

char * skip_int(char *start,int *out_n)

{
  int iVar1;
  ushort **ppuVar2;
  byte bVar3;
  byte *pbVar4;
  
  *out_n = 0;
  while( true ) {
    bVar3 = *start;
    if ((bVar3 < 0xe) && ((0x2401U >> (bVar3 & 0x1f) & 1) != 0)) break;
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (long)(char)bVar3 * 2 + 1) & 0x20) == 0) goto LAB_0010bfc3;
    start = (char *)((byte *)start + 1);
  }
  start = (char *)0x0;
LAB_0010bfc3:
  if ((byte *)start == (byte *)0x0) {
    pbVar4 = (byte *)0x0;
  }
  else {
    bVar3 = *start;
    pbVar4 = (byte *)start;
    if (bVar3 != 0) {
      ppuVar2 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar2 + (long)(char)bVar3 * 2 + 1) & 8) == 0) break;
        bVar3 = pbVar4[1];
        pbVar4 = pbVar4 + 1;
      } while (bVar3 != 0);
    }
    *pbVar4 = 0;
    iVar1 = atoi(start);
    *out_n = iVar1;
    *pbVar4 = bVar3;
  }
  return (char *)pbVar4;
}

Assistant:

static char *skip_int(char *start, int *out_n)
{
    char *s;
    char c;

    *out_n = 0;

    s = skip_white(start);
    if(s == NULL) return NULL;
    start = s;

    while(*s)
    {
        if( !isdigit(*s)) break;
        ++s;
    }
    c = *s; *s = 0; *out_n = atoi(start); *s = c;
    return s;
}